

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O1

bool __thiscall
tinyusdz::primvar::PrimVar::
get_interpolated_value<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>
          (PrimVar *this,double t,TimeSampleInterpolationType tinterp,
          vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *v)

{
  vtable_type *pvVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  uint32_t uVar6;
  undefined8 in_RCX;
  PrimVar *pPVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  anon_struct_8_0_00000001_for___align aVar10;
  undefined8 uVar11;
  optional<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_> pv;
  optional<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_> local_48;
  double local_28;
  
  if (v == (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)0x0) {
    return false;
  }
  uVar11 = &local_48;
  uVar9 = &local_48;
  if (NAN(t)) {
    uVar8 = this;
    local_28 = t;
    get_value<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>
              (&local_48,this);
    uVar4 = local_48.contained._16_8_;
    uVar3 = local_48.contained._8_8_;
    uVar2 = local_48.contained.data._0_8_;
    if (local_48.has_value_ == true) {
      local_48.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      local_48.contained._8_8_ = 0;
      local_48.contained._16_8_ = (PrimVar *)0x0;
      in_RCX = uVar3;
      uVar8 = uVar4;
      uVar11 = uVar2;
    }
    pPVar7 = (PrimVar *)uVar8;
    aVar10 = (anon_struct_8_0_00000001_for___align)uVar11;
    if (local_48.has_value_ != false) {
      pPVar7 = (PrimVar *)0x0;
      aVar10 = (anon_struct_8_0_00000001_for___align)0x0;
      local_48.contained.data._0_8_ = (undefined8)uVar11;
      local_48.contained._8_8_ = in_RCX;
      local_48.contained._16_8_ = uVar8;
    }
    in_RCX = CONCAT71((int7)((ulong)in_RCX >> 8),aVar10 != (anon_struct_8_0_00000001_for___align)0x0
                     );
    if ((local_48.has_value_ & aVar10 != (anon_struct_8_0_00000001_for___align)0x0) == 1) {
      operator_delete((void *)aVar10,(long)pPVar7 - (long)aVar10);
    }
    bVar5 = local_48.has_value_;
    if (local_48.has_value_ == true) {
      std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>::operator=
                (v,(vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                   &local_48.contained);
    }
    if ((local_48.has_value_ == true) &&
       (local_48.contained.data.__align != (anon_struct_8_0_00000001_for___align)0x0)) {
      operator_delete((void *)local_48.contained.data._0_8_,
                      local_48.contained._16_8_ - local_48.contained._0_8_);
    }
    if (bVar5 != false) {
      return true;
    }
    t = local_28;
    if ((this->_ts)._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->_ts)._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      return false;
    }
  }
  if ((this->_ts)._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->_ts)._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    bVar5 = tinyusdz::value::TimeSamples::
            get<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>,_nullptr>
                      (&this->_ts,v,t,tinterp);
    return bVar5;
  }
  if ((this->_blocked != false) ||
     (((pvVar1 = (this->_value).v_.vtable, pvVar1 == (vtable_type *)0x0 ||
       (uVar6 = (*pvVar1->type_id)(), uVar6 != 0)) &&
      ((pvVar1 = (this->_value).v_.vtable, pvVar1 == (vtable_type *)0x0 ||
       (uVar6 = (*pvVar1->type_id)(), uVar6 != 1)))))) {
    get_value<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>
              (&local_48,this);
    uVar3 = local_48.contained._16_8_;
    uVar2 = local_48.contained._8_8_;
    uVar11 = local_48.contained.data._0_8_;
    if (local_48.has_value_ == true) {
      local_48.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      local_48.contained._8_8_ = 0;
      local_48.contained._16_8_ = (PrimVar *)0x0;
      in_RCX = uVar2;
      this = (PrimVar *)uVar3;
      uVar9 = uVar11;
    }
    pPVar7 = this;
    aVar10 = (anon_struct_8_0_00000001_for___align)uVar9;
    if (local_48.has_value_ != false) {
      aVar10 = (anon_struct_8_0_00000001_for___align)0x0;
      pPVar7 = (PrimVar *)0x0;
      local_48.contained.data._0_8_ = (undefined8)uVar9;
      local_48.contained._8_8_ = in_RCX;
      local_48.contained._16_8_ = this;
    }
    if ((local_48.has_value_ & aVar10 != (anon_struct_8_0_00000001_for___align)0x0) == 1) {
      operator_delete((void *)aVar10,(long)pPVar7 - (long)aVar10);
    }
    bVar5 = local_48.has_value_;
    if (local_48.has_value_ == true) {
      std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>::operator=
                (v,(vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                   &local_48.contained);
    }
    if ((local_48.has_value_ == true) &&
       (local_48.contained.data.__align != (anon_struct_8_0_00000001_for___align)0x0)) {
      operator_delete((void *)local_48.contained.data._0_8_,
                      local_48.contained._16_8_ - local_48.contained._0_8_);
    }
    if (bVar5 != false) {
      return true;
    }
  }
  return false;
}

Assistant:

bool get_interpolated_value(const double t, const value::TimeSampleInterpolationType tinterp, T *v) const {
    if (!v) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {

      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }

      if (_ts.empty()) {
        return false;
      }
    }

    if (has_timesamples()) {
      return _ts.get(v, t, tinterp);
    }

    if (has_default()) {
      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }
    }

    return false;
  }